

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  CookieInfo *ci;
  curl_trc_feat *pcVar1;
  uint uVar2;
  CURLcode error;
  int iVar3;
  void *__base;
  Curl_llist_node *n;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  undefined7 in_register_00000031;
  long lVar7;
  byte *filename;
  char cVar8;
  undefined8 unaff_R15;
  ulong uVar9;
  size_t __nmemb;
  FILE *out;
  char *local_48;
  uint local_40;
  undefined4 local_3c;
  byte *local_38;
  
  pcVar5 = (data->set).str[0x1b];
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  if (pcVar5 == (char *)0x0) goto LAB_0011e7f6;
  ci = data->cookies;
  filename = (byte *)(data->set).str[0x1b];
  out = (FILE *)0x0;
  local_48 = (char *)0x0;
  if (ci == (CookieInfo *)0x0) goto LAB_0011e7f6;
  remove_expired(ci);
  uVar2 = *filename - 0x2d;
  if (uVar2 == 0) {
    uVar2 = (uint)filename[1];
  }
  if (uVar2 == 0) {
    out = _stdout;
    uVar9 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
LAB_0011e613:
    fputs("# Netscape HTTP Cookie File\n# https://curl.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
          ,(FILE *)out);
    if ((ulong)ci->numcookies != 0) {
      __base = (*Curl_ccalloc)(1,(ulong)ci->numcookies << 3);
      if (__base == (void *)0x0) {
LAB_0011e77d:
        cVar8 = (char)uVar9;
        error = CURLE_OUT_OF_MEMORY;
        goto LAB_0011e781;
      }
      local_40 = (uint)uVar9;
      local_3c = (undefined4)CONCAT71(in_register_00000031,cleanup);
      __nmemb = 0;
      local_38 = filename;
      for (lVar7 = 0; lVar7 != 0x3f; lVar7 = lVar7 + 1) {
        for (n = Curl_llist_head(ci->cookielist + lVar7); n != (Curl_llist_node *)0x0;
            n = Curl_node_next(n)) {
          pvVar4 = Curl_node_elem(n);
          if (*(long *)((long)pvVar4 + 0x60) != 0) {
            *(void **)((long)__base + __nmemb * 8) = pvVar4;
            __nmemb = __nmemb + 1;
          }
        }
      }
      qsort(__base,__nmemb,8,cookie_sort_ct);
      for (uVar2 = 0; uVar2 < __nmemb; uVar2 = uVar2 + 1) {
        pcVar5 = get_netscape_format(*(Cookie **)((long)__base + (ulong)uVar2 * 8));
        if (pcVar5 == (char *)0x0) {
          (*Curl_cfree)(__base);
          cleanup = SUB41(local_3c,0);
          uVar9 = (ulong)local_40;
          goto LAB_0011e77d;
        }
        curl_mfprintf(out,"%s\n",pcVar5);
        (*Curl_cfree)(pcVar5);
      }
      (*Curl_cfree)(__base);
      cleanup = SUB41(local_3c,0);
      uVar9 = (ulong)local_40;
      filename = local_38;
    }
    pcVar5 = local_48;
    if ((char)uVar9 == '\0') {
      fclose((FILE *)out);
      out = (FILE *)0x0;
      if (local_48 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        iVar3 = Curl_rename(local_48,(char *)filename);
        pcVar5 = local_48;
        if (iVar3 != 0) {
          unlink(local_48);
          error = CURLE_WRITE_ERROR;
          cVar8 = '\0';
          goto LAB_0011e781;
        }
      }
    }
    (*Curl_cfree)(pcVar5);
  }
  else {
    error = Curl_fopen(data,(char *)filename,&out,&local_48);
    if (error == CURLE_OK) {
      uVar9 = 0;
      goto LAB_0011e613;
    }
    cVar8 = '\0';
LAB_0011e781:
    if ((out != (FILE *)0x0) && (cVar8 == '\0')) {
      fclose((FILE *)out);
    }
    (*Curl_cfree)(local_48);
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
      pcVar5 = (data->set).str[0x1b];
      pcVar6 = curl_easy_strerror(error);
      Curl_infof(data,"WARNING: failed to save cookies in %s: %s",pcVar5,pcVar6);
    }
  }
LAB_0011e7f6:
  if (cleanup != false) {
    if ((data->share == (Curl_share *)0x0) || (data->cookies != data->share->cookies)) {
      Curl_cookie_cleanup(data->cookies);
      data->cookies = (CookieInfo *)0x0;
    }
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  CURLcode res;

  if(data->set.str[STRING_COOKIEJAR]) {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    res = cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]);
    if(res)
      infof(data, "WARNING: failed to save cookies in %s: %s",
            data->set.str[STRING_COOKIEJAR], curl_easy_strerror(res));
  }
  else {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}